

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z2_Nx4_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left,int upsample_above,
               int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long in_RCX;
  long in_RDX;
  undefined2 in_SI;
  undefined6 in_register_00000032;
  int in_EDI;
  long in_R8;
  uint in_R9D;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bStack0000000000000008;
  __m128i mask128;
  __m128i base_y_c128;
  __m128i y_c128;
  int16_t base_y_c [8];
  __m128i shifty;
  __m128i a1_y;
  __m128i a0_y;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  __m128i a1_x128;
  __m128i a0_x128;
  __m128i resxy;
  __m128i resy;
  __m128i resx;
  __m128i ydx;
  __m128i r6;
  __m128i shift;
  __m128i res;
  __m128i b;
  int r;
  __m128i dy128;
  __m128i c1234;
  __m128i min_base_y128;
  __m128i c3f;
  __m128i diff;
  __m128i a16;
  __m128i a32;
  __m128i a1_x;
  __m128i a0_x;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  short local_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  undefined1 local_830 [16];
  int local_800;
  int local_7fc;
  ulong local_7f0;
  ulong local_7e0;
  undefined1 local_780 [16];
  int local_744;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  ushort local_6a4;
  byte local_69c;
  undefined4 *local_680;
  undefined4 local_610;
  
  local_680 = (undefined4 *)CONCAT62(in_register_00000032,in_SI);
  local_69c = (byte)in_R9D;
  iVar11 = -(1 << (local_69c & 0x1f));
  uVar9 = -(1 << (bStack0000000000000008 & 0x1f));
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  auVar1 = vpinsrw_avx(auVar1,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar2 = vpinsrw_avx(auVar2,0x3f,2);
  auVar2 = vpinsrw_avx(auVar2,0x3f,3);
  auVar2 = vpinsrw_avx(auVar2,0x3f,4);
  auVar2 = vpinsrw_avx(auVar2,0x3f,5);
  auVar2 = vpinsrw_avx(auVar2,0x3f,6);
  auVar2 = vpinsrw_avx(auVar2,0x3f,7);
  local_6a4 = (ushort)uVar9;
  auVar3 = vpinsrw_avx(ZEXT216(local_6a4),uVar9 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar9 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar9 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar9 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar9 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar9 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar9 & 0xffff,7);
  auVar4 = vpinsrw_avx(ZEXT216(0),1,1);
  auVar4 = vpinsrw_avx(auVar4,2,2);
  auVar4 = vpinsrw_avx(auVar4,3,3);
  auVar4 = vpinsrw_avx(auVar4,4,4);
  auVar4 = vpinsrw_avx(auVar4,0,5);
  auVar4 = vpinsrw_avx(auVar4,0,6);
  auVar4 = vpinsrw_avx(auVar4,0,7);
  auVar5 = vpinsrw_avx(ZEXT216((ushort)dx),dx & 0xffff,1);
  auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,2);
  auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,3);
  auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,4);
  auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,5);
  auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,7);
  for (local_744 = 0; local_744 < in_EDI; local_744 = local_744 + 1) {
    iVar10 = -(local_744 + 1) * upsample_left >> (6 - local_69c & 0x1f);
    local_7fc = 0;
    if (iVar10 < iVar11 + -1) {
      local_7fc = (iVar11 - iVar10) + -1 >> (local_69c & 0x1f);
    }
    local_800 = (int)((iVar11 - iVar10) + in_R9D) >> (local_69c & 0x1f);
    if (local_800 < 5) {
      if (local_800 < 0) {
        local_800 = 0;
      }
    }
    else {
      local_800 = 4;
    }
    if (local_7fc < 4) {
      auVar12 = *(undefined1 (*) [16])(in_RCX + iVar10 + (long)local_7fc);
      uVar8 = (short)(local_744 + 1) * (short)upsample_left;
      auVar6 = vpinsrw_avx(ZEXT216(uVar8),(uint)uVar8,1);
      auVar6 = vpinsrw_avx(auVar6,(uint)uVar8,2);
      auVar6 = vpinsrw_avx(auVar6,(uint)uVar8,3);
      auVar6 = vpinsrw_avx(auVar6,(uint)uVar8,4);
      auVar6 = vpinsrw_avx(auVar6,(uint)uVar8,5);
      auVar6 = vpinsrw_avx(auVar6,(uint)uVar8,6);
      auVar6 = vpinsrw_avx(auVar6,(uint)uVar8,7);
      auVar13 = vpsllw_avx(auVar4,ZEXT416(6));
      if (in_R9D == 0) {
        auVar12 = vpshufb_avx(auVar12,(undefined1  [16])LoadMaskx[local_7fc]);
        local_7e0 = auVar12._0_8_;
        auVar12 = vpsrldq_avx(auVar12,1);
        local_7f0 = auVar12._0_8_;
        auVar6 = vpsubw_avx(auVar13,auVar6);
        auVar6 = vpand_avx(auVar6,auVar2);
        local_780 = vpsrlw_avx(auVar6,ZEXT416(1));
      }
      else {
        auVar12 = vpshufb_avx(auVar12,(undefined1  [16])EvenOddMaskx[local_7fc]);
        local_7e0 = auVar12._0_8_;
        auVar12 = vpsrldq_avx(auVar12,8);
        local_7f0 = auVar12._0_8_;
        auVar6 = vpsubw_avx(auVar13,auVar6);
        auVar6 = vpsllw_avx(auVar6,ZEXT416(in_R9D));
        auVar6 = vpand_avx(auVar6,auVar2);
        local_780 = vpsrlw_avx(auVar6,ZEXT416(1));
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_7e0;
      local_6c0 = vpmovzxbw_avx(auVar6);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_7f0;
      local_6d0 = vpmovzxbw_avx(auVar13);
    }
    else {
      local_6c0 = ZEXT816(0);
      local_6d0 = ZEXT816(0);
      local_780 = ZEXT816(0);
    }
    if (iVar10 < iVar11) {
      auVar13 = vpsrldq_avx(auVar4,2);
      uVar9 = local_744 << 6;
      auVar6 = vpinsrw_avx(ZEXT216((ushort)uVar9),uVar9 & 0xffff,1);
      auVar6 = vpinsrw_avx(auVar6,uVar9 & 0xffff,2);
      auVar6 = vpinsrw_avx(auVar6,uVar9 & 0xffff,3);
      auVar6 = vpinsrw_avx(auVar6,uVar9 & 0xffff,4);
      auVar6 = vpinsrw_avx(auVar6,uVar9 & 0xffff,5);
      auVar6 = vpinsrw_avx(auVar6,uVar9 & 0xffff,6);
      auVar6 = vpinsrw_avx(auVar6,uVar9 & 0xffff,7);
      auVar13 = vpmullw_avx(auVar13,auVar5);
      auVar7 = vpsubw_avx(auVar6,auVar13);
      auVar13 = vpsraw_avx(auVar7,ZEXT416(6 - _bStack0000000000000008));
      auVar6 = vpcmpgtw_avx(auVar3,auVar13);
      auVar6 = vpandn_avx(auVar6,auVar13);
      sStack_83a = auVar6._6_2_;
      sStack_83c = auVar6._4_2_;
      sStack_83e = auVar6._2_2_;
      local_840 = auVar6._0_2_;
      auVar13 = vpinsrw_avx(ZEXT116(*(byte *)(in_R8 + local_840)),
                            (uint)*(byte *)(in_R8 + sStack_83e),1);
      auVar13 = vpinsrw_avx(auVar13,(uint)*(byte *)(in_R8 + sStack_83c),2);
      auVar13 = vpinsrw_avx(auVar13,(uint)*(byte *)(in_R8 + sStack_83a),3);
      auVar13 = vpinsrw_avx(auVar13,0,4);
      auVar13 = vpinsrw_avx(auVar13,0,5);
      auVar13 = vpinsrw_avx(auVar13,0,6);
      auVar13 = vpinsrw_avx(auVar13,0,7);
      auVar12 = vpsrlw_avx(auVar1,ZEXT416(4));
      auVar6 = vpaddw_avx(auVar6,auVar12);
      sStack_83a = auVar6._6_2_;
      sStack_83c = auVar6._4_2_;
      sStack_83e = auVar6._2_2_;
      local_840 = auVar6._0_2_;
      auVar6 = vpinsrw_avx(ZEXT116(*(byte *)(in_R8 + local_840)),(uint)*(byte *)(in_R8 + sStack_83e)
                           ,1);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(byte *)(in_R8 + sStack_83c),2);
      auVar6 = vpinsrw_avx(auVar6,(uint)*(byte *)(in_R8 + sStack_83a),3);
      auVar6 = vpinsrw_avx(auVar6,0,4);
      auVar6 = vpinsrw_avx(auVar6,0,5);
      auVar6 = vpinsrw_avx(auVar6,0,6);
      auVar6 = vpinsrw_avx(auVar6,0,7);
      if (_bStack0000000000000008 == 0) {
        auVar12 = vpand_avx(auVar7,auVar2);
        local_830 = vpsrlw_avx(auVar12,ZEXT416(1));
      }
      else {
        auVar12 = vpsllw_avx(auVar7,ZEXT416(_bStack0000000000000008));
        auVar12 = vpand_avx(auVar12,auVar2);
        local_830 = vpsrlw_avx(auVar12,ZEXT416(1));
      }
      local_6c0 = vpunpcklqdq_avx(local_6c0,auVar13);
      local_6d0 = vpunpcklqdq_avx(local_6d0,auVar6);
      local_780 = vpunpcklqdq_avx(local_780,local_830);
    }
    auVar13 = vpsubw_avx(local_6d0,local_6c0);
    auVar6 = vpsllw_avx(local_6c0,ZEXT416(5));
    auVar6 = vpaddw_avx(auVar6,auVar1);
    auVar13 = vpmullw_avx(auVar13,local_780);
    auVar6 = vpaddw_avx(auVar6,auVar13);
    auVar6 = vpsrlw_avx(auVar6,ZEXT416(5));
    auVar6 = vpackuswb_avx(auVar6,auVar6);
    auVar13 = vpsrldq_avx(auVar6,4);
    auVar6 = vpblendvb_avx(auVar6,auVar13,*(undefined1 (*) [16])BaseMask[local_800]);
    local_610 = auVar6._0_4_;
    *local_680 = local_610;
    local_680 = (undefined4 *)(in_RDX + (long)local_680);
  }
  return;
}

Assistant:

static void dr_prediction_z2_Nx4_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above, const uint8_t *left,
                                      int upsample_above, int upsample_left,
                                      int dx, int dy) {
  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  assert(dx > 0);
  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i a0_x, a1_x, a32, a16, diff;
  __m128i c3f, min_base_y128, c1234, dy128;

  a16 = _mm_set1_epi16(16);
  c3f = _mm_set1_epi16(0x3f);
  min_base_y128 = _mm_set1_epi16(min_base_y);
  c1234 = _mm_setr_epi16(0, 1, 2, 3, 4, 0, 0, 0);
  dy128 = _mm_set1_epi16(dy);

  for (int r = 0; r < N; r++) {
    __m128i b, res, shift, r6, ydx;
    __m128i resx, resy, resxy;
    __m128i a0_x128, a1_x128;
    int y = r + 1;
    int base_x = (-y * dx) >> frac_bits_x;
    int base_shift = 0;
    if (base_x < (min_base_x - 1)) {
      base_shift = (min_base_x - base_x - 1) >> upsample_above;
    }
    int base_min_diff =
        (min_base_x - base_x + upsample_above) >> upsample_above;
    if (base_min_diff > 4) {
      base_min_diff = 4;
    } else {
      if (base_min_diff < 0) base_min_diff = 0;
    }

    if (base_shift > 3) {
      a0_x = _mm_setzero_si128();
      a1_x = _mm_setzero_si128();
      shift = _mm_setzero_si128();
    } else {
      a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
      ydx = _mm_set1_epi16(y * dx);
      r6 = _mm_slli_epi16(c1234, 6);

      if (upsample_above) {
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)EvenOddMaskx[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 8);

        shift = _mm_srli_epi16(
            _mm_and_si128(
                _mm_slli_epi16(_mm_sub_epi16(r6, ydx), upsample_above), c3f),
            1);
      } else {
        a0_x128 = _mm_shuffle_epi8(a0_x128, *(__m128i *)LoadMaskx[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 1);

        shift = _mm_srli_epi16(_mm_and_si128(_mm_sub_epi16(r6, ydx), c3f), 1);
      }
      a0_x = _mm_cvtepu8_epi16(a0_x128);
      a1_x = _mm_cvtepu8_epi16(a1_x128);
    }
    // y calc
    __m128i a0_y, a1_y, shifty;
    if (base_x < min_base_x) {
      DECLARE_ALIGNED(32, int16_t, base_y_c[8]);
      __m128i y_c128, base_y_c128, mask128, c1234_;
      c1234_ = _mm_srli_si128(c1234, 2);
      r6 = _mm_set1_epi16(r << 6);
      y_c128 = _mm_sub_epi16(r6, _mm_mullo_epi16(c1234_, dy128));
      base_y_c128 = _mm_srai_epi16(y_c128, frac_bits_y);
      mask128 = _mm_cmpgt_epi16(min_base_y128, base_y_c128);
      base_y_c128 = _mm_andnot_si128(mask128, base_y_c128);
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);

      a0_y = _mm_setr_epi16(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]], 0, 0, 0, 0);
      base_y_c128 = _mm_add_epi16(base_y_c128, _mm_srli_epi16(a16, 4));
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);
      a1_y = _mm_setr_epi16(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]], 0, 0, 0, 0);

      if (upsample_left) {
        shifty = _mm_srli_epi16(
            _mm_and_si128(_mm_slli_epi16(y_c128, upsample_left), c3f), 1);
      } else {
        shifty = _mm_srli_epi16(_mm_and_si128(y_c128, c3f), 1);
      }
      a0_x = _mm_unpacklo_epi64(a0_x, a0_y);
      a1_x = _mm_unpacklo_epi64(a1_x, a1_y);
      shift = _mm_unpacklo_epi64(shift, shifty);
    }

    diff = _mm_sub_epi16(a1_x, a0_x);  // a[x+1] - a[x]
    a32 = _mm_slli_epi16(a0_x, 5);     // a[x] * 32
    a32 = _mm_add_epi16(a32, a16);     // a[x] * 32 + 16

    b = _mm_mullo_epi16(diff, shift);
    res = _mm_add_epi16(a32, b);
    res = _mm_srli_epi16(res, 5);

    resx = _mm_packus_epi16(res, res);
    resy = _mm_srli_si128(resx, 4);

    resxy = _mm_blendv_epi8(resx, resy, *(__m128i *)BaseMask[base_min_diff]);
    *(int *)(dst) = _mm_cvtsi128_si32(resxy);
    dst += stride;
  }
}